

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

XmlRpcValue miniros::xmlrpc::responseInt(int code,string *msg,int response)

{
  XmlRpcValue *this;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  string *in_RDI;
  XmlRpcValue XVar1;
  XmlRpcValue *v;
  int in_stack_ffffffffffffff8c;
  XmlRpcValue *in_stack_ffffffffffffff90;
  string *value;
  int *in_stack_ffffffffffffffb8;
  XmlRpcValue *in_stack_ffffffffffffffc0;
  XmlRpcValue *in_stack_ffffffffffffffc8;
  XmlRpcValue *in_stack_ffffffffffffffd0;
  
  value = in_RDI;
  XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)in_RDI);
  this = XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  XmlRpc::XmlRpcValue::XmlRpcValue(this,value);
  XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x49568b);
  XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  XVar1._value.asDouble = extraout_RDX.asDouble;
  XVar1._0_8_ = in_RDI;
  return XVar1;
}

Assistant:

XmlRpc::XmlRpcValue responseInt(int code, const std::string& msg, int response)
{
  XmlRpc::XmlRpcValue v;
  v[0] = int(code);
  v[1] = msg;
  v[2] = response;
  return v;
}